

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateCaseEnum
          (OneofGenerator *this,Printer *printer)

{
  undefined8 this_00;
  int iVar1;
  mapped_type *pmVar2;
  FieldDescriptor *field_00;
  AlphaNum *a;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  AlphaNum local_e8;
  string local_b8;
  undefined1 local_98 [8];
  string field_name;
  FieldDescriptor *field;
  int j;
  allocator local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string enum_name;
  Printer *printer_local;
  OneofGenerator *this_local;
  
  variables = &this->variables_;
  enum_name.field_2._8_8_ = printer;
  io::Printer::Print(printer,variables,"typedef GPB_ENUM($enum_name$) {\n");
  io::Printer::Indent((Printer *)enum_name.field_2._8_8_);
  io::Printer::Print((Printer *)enum_name.field_2._8_8_,variables,
                     "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"enum_name",&local_59);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::string((string *)local_38,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  field._0_4_ = 0;
  while( true ) {
    iVar1 = OneofDescriptor::field_count(this->descriptor_);
    if (iVar1 <= (int)field) break;
    field_name.field_2._8_8_ = OneofDescriptor::field(this->descriptor_,(int)field);
    FieldNameCapitalized_abi_cxx11_
              ((string *)local_98,(objectivec *)field_name.field_2._8_8_,field_00);
    this_00 = enum_name.field_2._8_8_;
    iVar1 = FieldDescriptor::number((FieldDescriptor *)field_name.field_2._8_8_);
    strings::AlphaNum::AlphaNum(&local_e8,iVar1);
    StrCat_abi_cxx11_(&local_b8,(protobuf *)&local_e8,a);
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
              ((Printer *)this_00,"$enum_name$_$field_name$ = $field_number$,\n",
               (char (*) [10])"enum_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [11])0x792674,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (char (*) [13])"field_number",&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_98);
    field._0_4_ = (int)field + 1;
  }
  io::Printer::Outdent((Printer *)enum_name.field_2._8_8_);
  io::Printer::Print<>((Printer *)enum_name.field_2._8_8_,"};\n\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void OneofGenerator::GenerateCaseEnum(io::Printer* printer) {
  printer->Print(
      variables_,
      "typedef GPB_ENUM($enum_name$) {\n");
  printer->Indent();
  printer->Print(
      variables_,
      "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::string enum_name = variables_["enum_name"];
  for (int j = 0; j < descriptor_->field_count(); j++) {
    const FieldDescriptor* field = descriptor_->field(j);
    std::string field_name = FieldNameCapitalized(field);
    printer->Print(
        "$enum_name$_$field_name$ = $field_number$,\n",
        "enum_name", enum_name,
        "field_name", field_name,
        "field_number", StrCat(field->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");
}